

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

w3Tag __thiscall w3Module::read_blocktype(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  string local_40;
  uint local_1c;
  uint8_t **ppuStack_18;
  uint32_t block_type;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  ppuStack_18 = cursor;
  cursor_local = (uint8_t **)this;
  bVar1 = read_byte(this,cursor);
  local_1c = (uint)bVar1;
  if ((local_1c != 0x40) && (3 < local_1c - 0x7c)) {
    StringFormat_abi_cxx11_(&local_40,"invalid BlockType:%X",(ulong)local_1c);
    ThrowString(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (w3Tag)local_1c;
}

Assistant:

w3Tag w3Module::read_blocktype(uint8_t** cursor)
{
    const uint32_t block_type = read_byte (cursor);
    switch (block_type)
    {
    default:
        ThrowString (StringFormat ("invalid BlockType:%X", block_type));
        break;
    case Tag_i32:
    case Tag_i64:
    case Tag_f32:
    case Tag_f64:
    case Tag_empty:
        break;
    }
    return (w3Tag)block_type;
}